

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table.c++
# Opt level: O3

void __thiscall kj::_::BTreeImpl::growTree(BTreeImpl *this,uint minCapacity)

{
  uint uVar1;
  NodeUnion *__src;
  uint uVar2;
  NodeUnion *__dest;
  uint uVar3;
  ulong uVar4;
  uint newCapacity;
  Fault f;
  
  uVar1 = this->treeCapacity;
  uVar2 = uVar1 * 2;
  if (uVar1 * 2 < minCapacity) {
    uVar2 = minCapacity;
  }
  uVar4 = 4;
  if (4 < uVar2) {
    uVar4 = (ulong)uVar2;
  }
  uVar3 = (uint)uVar4;
  this->freelistSize = this->freelistSize + (uVar3 - uVar1);
  newCapacity = uVar3;
  __dest = (NodeUnion *)aligned_alloc(0x40,uVar4 << 6);
  if (__dest != (NodeUnion *)0x0) {
    __src = this->tree;
    memcpy(__dest,__src,(ulong)uVar1 * 0x40);
    memset(__dest + uVar1,0,(ulong)(uVar3 - uVar1) << 6);
    if (__src != (NodeUnion *)EMPTY_NODE) {
      free(__src);
    }
    this->tree = __dest;
    this->treeCapacity = uVar3;
    return;
  }
  Debug::Fault::Fault<kj::Exception::Type,char_const(&)[25],unsigned_int&>
            (&f,
             "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/table.c++"
             ,0x137,FAILED,"newTree != nullptr","\"memory allocation failed\", newCapacity",
             (char (*) [25])"memory allocation failed",&newCapacity);
  Debug::Fault::fatal(&f);
}

Assistant:

void BTreeImpl::growTree(uint minCapacity) {
  uint newCapacity = kj::max(kj::max(minCapacity, treeCapacity * 2), 4);
  freelistSize += newCapacity - treeCapacity;

  // Allocate some aligned memory! In theory this should be as simple as calling the C11 standard
  // aligned_alloc() function. Unfortunately, many platforms don't implement it. Luckily, there
  // are usually alternatives.

#if __APPLE__ || __BIONIC__
  // OSX and Android lack aligned_alloc(), but have posix_memalign(). Fine.
  void* allocPtr;
  int error = posix_memalign(&allocPtr,
      sizeof(BTreeImpl::NodeUnion), newCapacity * sizeof(BTreeImpl::NodeUnion));
  if (error != 0) {
    KJ_FAIL_SYSCALL("posix_memalign", error);
  }
  NodeUnion* newTree = reinterpret_cast<NodeUnion*>(allocPtr);
#elif _WIN32
  // Windows lacks aligned_alloc() but has its own _aligned_malloc() (which requires freeing using
  // _aligned_free()).
  // WATCH OUT: The argument order for _aligned_malloc() is opposite of aligned_alloc()!
  NodeUnion* newTree = reinterpret_cast<NodeUnion*>(
      _aligned_malloc(newCapacity * sizeof(BTreeImpl::NodeUnion), sizeof(BTreeImpl::NodeUnion)));
  KJ_ASSERT(newTree != nullptr, "memory allocation failed", newCapacity);
#else
  // Let's use the C11 standard.
  NodeUnion* newTree = reinterpret_cast<NodeUnion*>(
      aligned_alloc(sizeof(BTreeImpl::NodeUnion), newCapacity * sizeof(BTreeImpl::NodeUnion)));
  KJ_ASSERT(newTree != nullptr, "memory allocation failed", newCapacity);
#endif

  acopy(newTree, tree, treeCapacity);
  azero(newTree + treeCapacity, newCapacity - treeCapacity);
  if (tree != &EMPTY_NODE) aligned_free(tree);
  tree = newTree;
  treeCapacity = newCapacity;
}